

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

void EmitCallInstr(ParseNodeCall *pnodeCall,BOOL fIsEval,BOOL fHasNewTarget,RegSlot thisLocation,
                  RegSlot callObjLocation,uint32 actualArgCount,ByteCodeGenerator *byteCodeGenerator
                  ,FuncInfo *funcInfo,ProfileId callSiteId,AuxArray<unsigned_int> *spreadIndices)

{
  if (thisLocation != 0xffffffff) {
    FuncInfo::ReleaseTmpRegister(funcInfo,thisLocation);
  }
  if (callObjLocation != thisLocation && callObjLocation != 0xffffffff) {
    FuncInfo::ReleaseTmpRegister(funcInfo,callObjLocation);
  }
  EmitCallI(pnodeCall,1,fIsEval,fHasNewTarget,actualArgCount,byteCodeGenerator,funcInfo,callSiteId,
            spreadIndices);
  return;
}

Assistant:

void EmitCallInstr(
    ParseNodeCall *pnodeCall,
    BOOL fIsEval,
    BOOL fHasNewTarget,
    Js::RegSlot thisLocation,
    Js::RegSlot callObjLocation,
    uint32 actualArgCount,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::AuxArray<uint32> *spreadIndices = nullptr)
{
    // Emit a call instruction. The call target has been fully evaluated already, so we always
    // emit a CallI through the register that holds the target value.
    // Note that we don't handle !fEvaluateComponents cases at this point.
    // (This function is only called on the fEvaluateComponents branch in EmitCall.)

    if (thisLocation != Js::Constants::NoRegister)
    {
        funcInfo->ReleaseTmpRegister(thisLocation);
    }

    if (callObjLocation != Js::Constants::NoRegister &&
        callObjLocation != thisLocation)
    {
        funcInfo->ReleaseTmpRegister(callObjLocation);
    }

    EmitCallI(pnodeCall, /*fEvaluateComponents*/ TRUE, fIsEval, fHasNewTarget, actualArgCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
}